

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

string * __thiscall
google::protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view action,MessageLite *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  AlphaNum local_120;
  string_view local_f0 [3];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_f0[0] = absl::lts_20250127::NullSafeStringView("Can\'t ");
  local_120.piece_._M_len = (size_t)this;
  local_120.piece_._M_str = (char *)action._M_len;
  local_60.piece_ = absl::lts_20250127::NullSafeStringView(" message of type \"");
  local_90.piece_ = MessageLite::GetTypeName((MessageLite *)action._M_str);
  local_c0.piece_ =
       absl::lts_20250127::NullSafeStringView("\" because it is missing required fields: ");
  MessageLite::InitializationErrorString_abi_cxx11_
            ((string *)&stack0xfffffffffffffec0,(MessageLite *)action._M_str);
  absl::lts_20250127::StrCat<std::__cxx11::string>
            (__return_storage_ptr__,(lts_20250127 *)local_f0,&local_120,&local_60,&local_90,
             &local_c0,(AlphaNum *)&stack0xfffffffffffffec0,in_stack_fffffffffffffec0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializationErrorMessage(absl::string_view action,
                                       const MessageLite& message) {
  return absl::StrCat("Can't ", action, " message of type \"",
                      message.GetTypeName(),
                      "\" because it is missing required fields: ",
                      message.InitializationErrorString());
}